

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

SDL12_Surface * EndVidModeCreate(void)

{
  QueuedOverlayItem *pQVar1;
  QueuedOverlayItem *pQVar2;
  
  if (OpenGLBlitTexture != 0) {
    (*OpenGLFuncs.glDeleteTextures)(1,&OpenGLBlitTexture);
    OpenGLBlitTexture = 0;
  }
  if (VideoTexture20 != (SDL_Texture *)0x0) {
    (*SDL20_DestroyTexture)(VideoTexture20);
    VideoTexture20 = (SDL_Texture *)0x0;
  }
  if (VideoRenderer20 != (SDL_Renderer *)0x0) {
    (*SDL20_DestroyRenderer)(VideoRenderer20);
    VideoRenderer20 = (SDL_Renderer *)0x0;
  }
  if (VideoRendererLock != (SDL_mutex *)0x0) {
    (*SDL20_DestroyMutex)(VideoRendererLock);
    VideoRendererLock = (SDL_mutex *)0x0;
  }
  if (VideoGLContext20 != (SDL_GLContext)0x0) {
    (*SDL20_GL_MakeCurrent)((SDL_Window *)0x0,(SDL_GLContext)0x0);
    (*SDL20_GL_DeleteContext)(VideoGLContext20);
    VideoGLContext20 = (SDL_GLContext)0x0;
  }
  if (VideoWindow20 != (SDL_Window *)0x0) {
    (*SDL20_DestroyWindow)(VideoWindow20);
    VideoWindow20 = (SDL_Window *)0x0;
  }
  if (VideoPhysicalPalette20 != (SDL_Palette *)0x0) {
    (*SDL20_FreePalette)(VideoPhysicalPalette20);
    VideoPhysicalPalette20 = (SDL_Palette *)0x0;
  }
  if (VideoSurface12 != (SDL12_Surface *)0x0) {
    (*SDL20_free)(VideoSurface12Location.pixels);
    VideoSurface12Location.pixels = (void *)0x0;
    FreeSurfaceContents(VideoSurface12);
  }
  if (VideoConvertSurface20 != (SDL_Surface *)0x0) {
    (*SDL20_FreeSurface)(VideoConvertSurface20);
    VideoConvertSurface20 = (SDL_Surface *)0x0;
  }
  (*SDL20_memset)(&OpenGLFuncs,0,0x1c0);
  OpenGLBlitLockCount = 0;
  OpenGLLogicalScalingWidth = 0;
  OpenGLLogicalScalingHeight = 0;
  OpenGLLogicalScalingFBO = 0;
  OpenGLLogicalScalingColor = 0;
  OpenGLLogicalScalingDepth = 0;
  OpenGLLogicalScalingMultisampleFBO = 0;
  OpenGLLogicalScalingMultisampleColor = 0;
  OpenGLLogicalScalingMultisampleDepth = 0;
  MouseInputIsRelative = SDL_FALSE;
  MousePosition_0 = 0;
  MousePosition_1 = 0;
  pQVar2 = QueuedDisplayOverlays.next;
  while (pQVar2 != (QueuedOverlayItem *)0x0) {
    pQVar1 = pQVar2->next;
    (*SDL20_free)(pQVar2);
    pQVar2 = pQVar1;
  }
  QueuedDisplayOverlays.next = (QueuedOverlayItem *)0x0;
  QueuedDisplayOverlaysTail = &QueuedDisplayOverlays;
  VideoSurfaceUpdatedInBackgroundThread = 0;
  SetVideoModeThread = 0;
  return (SDL12_Surface *)0x0;
}

Assistant:

static SDL12_Surface *
EndVidModeCreate(void)
{
    QueuedOverlayItem *overlay;

    if (OpenGLBlitTexture) {
        OpenGLFuncs.glDeleteTextures(1, &OpenGLBlitTexture);
        OpenGLBlitTexture = 0;
    }
    if (VideoTexture20) {
        SDL20_DestroyTexture(VideoTexture20);
        VideoTexture20 = NULL;
    }
    if (VideoRenderer20) {
        SDL20_DestroyRenderer(VideoRenderer20);
        VideoRenderer20 = NULL;
    }
    if (VideoRendererLock) {
        SDL20_DestroyMutex(VideoRendererLock);
        VideoRendererLock = NULL;
    }
    if (VideoGLContext20) {
        SDL20_GL_MakeCurrent(NULL, NULL);
        SDL20_GL_DeleteContext(VideoGLContext20);
        VideoGLContext20 = NULL;
    }
    if (VideoWindow20) {
        SDL20_DestroyWindow(VideoWindow20);
        VideoWindow20 = NULL;
    }
    if (VideoPhysicalPalette20) {
        SDL20_FreePalette(VideoPhysicalPalette20);
        VideoPhysicalPalette20 = NULL;
    }
    if (VideoSurface12) {
        SDL20_free(VideoSurface12->pixels);
        VideoSurface12->pixels = NULL;
        FreeSurfaceContents(VideoSurface12);
    }
    if (VideoConvertSurface20) {
        SDL20_FreeSurface(VideoConvertSurface20);
        VideoConvertSurface20 = NULL;
    }

    SDL20_zero(OpenGLFuncs);
    OpenGLBlitLockCount = 0;
    OpenGLLogicalScalingWidth = 0;
    OpenGLLogicalScalingHeight = 0;
    OpenGLLogicalScalingFBO = 0;
    OpenGLLogicalScalingColor = 0;
    OpenGLLogicalScalingDepth = 0;
    OpenGLLogicalScalingMultisampleFBO = 0;
    OpenGLLogicalScalingMultisampleColor = 0;
    OpenGLLogicalScalingMultisampleDepth = 0;

    MouseInputIsRelative = SDL_FALSE;
    MousePosition.x = 0;
    MousePosition.y = 0;

    overlay = QueuedDisplayOverlays.next;
    while (overlay != NULL) {
        QueuedOverlayItem *next = overlay->next;
        SDL_free(overlay);
        overlay = next;
    }
    QueuedDisplayOverlays.next = NULL;
    QueuedDisplayOverlaysTail = &QueuedDisplayOverlays;

    VideoSurfaceUpdatedInBackgroundThread = SDL_FALSE;
    SetVideoModeThread = 0;

    return NULL;
}